

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estimate_halfway.cc
# Opt level: O2

int main(void)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dStack_27130;
  double dStack_27120;
  sample samples [10000];
  
  dStack_27130 = 0.0;
  for (lVar4 = 8; lVar4 != 0x27108; lVar4 = lVar4 + 0x10) {
    dVar5 = random_double();
    dVar5 = dVar5 * 6.283185307179586 + 0.0;
    dStack_27120 = sin(dVar5);
    dVar6 = exp(dVar5 / -6.283185307179586);
    dVar6 = dVar6 * dStack_27120 * dStack_27120;
    dStack_27130 = dStack_27130 + dVar6;
    *(double *)((long)samples + lVar4 + -8) = dVar5;
    *(double *)((long)&samples[0].x + lVar4) = dVar6;
  }
  std::__sort<sample*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(sample_const&,sample_const&)>>
            (samples,(sample *)&stack0xffffffffffffffe8,
             (_Iter_comp_iter<bool_(*)(const_sample_&,_const_sample_&)>)0x101495);
  lVar4 = std::cout;
  dVar5 = 0.0;
  lVar1 = -0x10;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0x10 == 160000) {
      dVar5 = 0.0;
      goto LAB_00101585;
    }
    dVar5 = dVar5 + *(double *)((long)&samples[1].p_x + lVar2);
    lVar1 = lVar2 + 0x10;
  } while (dVar5 < dStack_27130 * 0.5);
  dVar5 = *(double *)((long)&samples[1].x + lVar2);
LAB_00101585:
  *(uint *)(memmove + *(long *)(std::cout + -0x18)) =
       *(uint *)(memmove + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(std::ios_base::Init::Init + *(long *)(lVar4 + -0x18)) = 0xc;
  std::operator<<((ostream *)&std::cout,"Average = ");
  poVar3 = std::ostream::_M_insert<double>(dStack_27130 / 10000.0);
  std::operator<<(poVar3,'\n');
  std::operator<<((ostream *)&std::cout,"Area under curve = ");
  poVar3 = std::ostream::_M_insert<double>((dStack_27130 * 6.283185307179586) / 10000.0);
  std::operator<<(poVar3,'\n');
  std::operator<<((ostream *)&std::cout,"Halfway = ");
  poVar3 = std::ostream::_M_insert<double>(dVar5);
  std::operator<<(poVar3,'\n');
  return 0;
}

Assistant:

int main() {
    const unsigned int N = 10000;
    sample samples[N];
    double sum = 0.0;

    // Iterate through all of our samples.

    for (unsigned int i = 0; i < N; i++) {
        // Get the area under the curve.
        auto x = random_double(0, 2*pi);
        auto sin_x = std::sin(x);
        auto p_x = exp(-x / (2*pi)) * sin_x * sin_x;
        sum += p_x;

        // Store this sample.
        sample this_sample = {x, p_x};
        samples[i] = this_sample;
    }

    // Sort the samples by x.
    std::sort(std::begin(samples), std::end(samples), compare_by_x);

    // Find out the sample at which we have half of our area.
    double half_sum = sum / 2.0;
    double halfway_point = 0.0;
    double accum = 0.0;
    for (unsigned int i = 0; i < N; i++){
        accum += samples[i].p_x;
        if (accum >= half_sum) {
            halfway_point = samples[i].x;
            break;
        }
    }

    std::cout << std::fixed << std::setprecision(12);
    std::cout << "Average = " << sum / N << '\n';
    std::cout << "Area under curve = " << 2 * pi * sum / N << '\n';
    std::cout << "Halfway = " << halfway_point << '\n';
}